

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall
IO::writeHomotetramers
          (IO *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *homotetramer_arr
          ,string *filename)

{
  float fVar1;
  pointer paVar2;
  ostream *poVar3;
  pointer paVar4;
  float fVar5;
  ofstream outstream;
  
  std::ofstream::ofstream((string *)&outstream);
  std::ofstream::open((string *)&outstream,(_Ios_Openmode)filename);
  paVar2 = (homotetramer_arr->
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar4 = (homotetramer_arr->
                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1) {
    fVar1 = paVar4->_M_elems[1];
    fVar5 = paVar4->_M_elems[0] + fVar1;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&outstream,paVar4->_M_elems[0] / fVar5);
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar1 / fVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outstream);
  return;
}

Assistant:

void IO::writeHomotetramers(std::vector<std::array<float, 2>> homotetramer_arr, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (auto timestep: homotetramer_arr){
		outstream << timestep.at(0)/(timestep.at(0)+timestep.at(1)) << "\t"
						 << timestep.at(1)/(timestep.at(0)+timestep.at(1)) << std::endl;
	}
	outstream.close();
}